

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O1

int Hash_Int2ManInsert(Hash_IntMan_t *p,int iData0,int iData1,int iData2)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int *piVar14;
  ulong uVar13;
  
  iVar9 = p->vObjs->nSize;
  iVar7 = iVar9 + 3;
  if (-1 < iVar9) {
    iVar7 = iVar9;
  }
  pVVar1 = p->vTable;
  uVar6 = iVar7 >> 2;
  if (pVVar1->nSize < (int)uVar6) {
    uVar10 = (ulong)(pVVar1->nSize * 2 - 1);
    while( true ) {
      do {
        uVar3 = (uint)uVar10;
        uVar12 = uVar3 + 1;
        uVar13 = (ulong)uVar12;
        uVar11 = uVar10 & 1;
        uVar10 = uVar13;
      } while (uVar11 != 0);
      if (uVar12 < 9) break;
      iVar7 = 5;
      while (uVar12 % (iVar7 - 2U) != 0) {
        uVar2 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar12 < uVar2) goto LAB_007022da;
      }
    }
LAB_007022da:
    if (pVVar1->nCap < (int)uVar12) {
      if (pVVar1->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar12 << 2);
      }
      else {
        piVar4 = (int *)realloc(pVVar1->pArray,(long)(int)uVar12 << 2);
      }
      pVVar1->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar1->nCap = uVar12;
    }
    if (uVar3 < 0x7fffffff) {
      memset(pVVar1->pArray,0,uVar13 << 2);
    }
    pVVar1->nSize = uVar12;
    if (7 < iVar9) {
      pVVar1 = p->vObjs;
      uVar10 = 2;
      if (2 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      uVar11 = 1;
      do {
        uVar3 = pVVar1->nSize;
        if ((long)(int)uVar3 <= (long)(uVar11 * 4)) goto LAB_007024e8;
        piVar4 = pVVar1->pArray;
        piVar4[uVar11 * 4 + 3] = 0;
        uVar12 = p->vTable->nSize;
        uVar13 = (ulong)(uint)(piVar4[uVar11 * 4 + 1] * 0x1ec1 + piVar4[uVar11 * 4] * 0x1051) %
                 (ulong)uVar12;
        iVar9 = (int)uVar13;
        if ((iVar9 < 0) || ((int)uVar12 <= iVar9)) goto LAB_007024e8;
        piVar5 = p->vTable->pArray + uVar13;
        while( true ) {
          iVar9 = *piVar5;
          if (iVar9 == 0) {
            piVar14 = (int *)0x0;
          }
          else {
            if ((iVar9 < 0) ||
               (uVar12 = iVar9 * 4,
               uVar3 == uVar12 || SBORROW4(uVar3,uVar12) != (int)(uVar3 + iVar9 * -4) < 0))
            goto LAB_007024e8;
            piVar14 = piVar4 + uVar12;
          }
          if (piVar14 == (int *)0x0) {
            if (iVar9 != 0) goto LAB_00702507;
            goto LAB_00702414;
          }
          if ((*piVar14 == piVar4[uVar11 * 4]) && (piVar14[1] == piVar4[uVar11 * 4 + 1])) break;
          piVar5 = piVar14 + 3;
        }
        if (iVar9 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHash.h"
                        ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
        }
LAB_00702414:
        *piVar5 = (int)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  uVar3 = p->vTable->nSize;
  uVar10 = (ulong)(uint)(iData1 * 0x1ec1 + iData0 * 0x1051) % (ulong)uVar3;
  iVar9 = (int)uVar10;
  if ((iVar9 < 0) || ((int)uVar3 <= iVar9)) {
LAB_007024e8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar8 = (uint *)(p->vTable->pArray + uVar10);
  while( true ) {
    uVar3 = *puVar8;
    if (uVar3 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      if ((int)uVar3 < 0) goto LAB_007024e8;
      uVar12 = uVar3 * 4;
      uVar2 = p->vObjs->nSize;
      if (uVar2 == uVar12 || SBORROW4(uVar2,uVar12) != (int)(uVar2 + uVar3 * -4) < 0)
      goto LAB_007024e8;
      piVar4 = p->vObjs->pArray + uVar12;
    }
    if (piVar4 == (int *)0x0) break;
    if ((*piVar4 == iData0) && (piVar4[1] == iData1)) {
      if (uVar3 == 0) {
LAB_0070249b:
        *puVar8 = uVar6;
        Vec_IntPush(p->vObjs,iData0);
        Vec_IntPush(p->vObjs,iData1);
        Vec_IntPush(p->vObjs,0);
        Vec_IntPush(p->vObjs,0);
        uVar3 = uVar6;
      }
      return uVar3;
    }
    puVar8 = (uint *)(piVar4 + 3);
  }
  if (uVar3 != 0) {
LAB_00702507:
    __assert_fail("*pPlace == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHash.h"
                  ,0x9b,"int *Hash_Int2ManLookup(Hash_IntMan_t *, int, int)");
  }
  goto LAB_0070249b;
}

Assistant:

static inline int Hash_Int2ManInsert( Hash_IntMan_t * p, int iData0, int iData1, int iData2 )
{
    Hash_IntObj_t * pObj;
    int i, nObjs, * pPlace;
    nObjs = Vec_IntSize(p->vObjs)/4;
    if ( nObjs > Vec_IntSize(p->vTable) )
    {
//        printf( "Resizing...\n" );
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), 0 );
        for ( i = 1; i < nObjs; i++ )
        {
            pObj = Hash_IntObj( p, i );
            pObj->iNext = 0;
            pPlace = Hash_Int2ManLookup( p, pObj->iData0, pObj->iData1 );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Hash_Int2ManLookup( p, iData0, iData1 );
    if ( *pPlace )
        return *pPlace;
    *pPlace = nObjs;
    Vec_IntPush( p->vObjs, iData0 );
    Vec_IntPush( p->vObjs, iData1 );
    Vec_IntPush( p->vObjs, iData2 );
    Vec_IntPush( p->vObjs, 0 );
    return nObjs;
}